

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O0

string * __thiscall booster::aio::endpoint::path_abi_cxx11_(endpoint *this)

{
  family_type fVar1;
  data *pdVar2;
  copy_ptr<booster::aio::endpoint::data> *in_RSI;
  string *in_RDI;
  endpoint *in_stack_ffffffffffffffb8;
  allocator *paVar3;
  string *this_00;
  allocator local_11 [17];
  
  this_00 = in_RDI;
  fVar1 = family(in_stack_ffffffffffffffb8);
  if (fVar1 != pf_unix) {
    throw_invalid((endpoint *)this_00);
  }
  pdVar2 = copy_ptr<booster::aio::endpoint::data>::operator->(in_RSI);
  paVar3 = local_11;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this_00,(pdVar2->sa).un.sun_path,paVar3);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  return in_RDI;
}

Assistant:

std::string endpoint::path() const
{
	if(family()!=pf_unix)
		throw_invalid();
	return d->sa.un.sun_path;
}